

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

bool __thiscall
nuraft::raft_server::try_update_precommit_index(raft_server *this,ulong desired,size_t MAX_ATTEMPTS)

{
  element_type *peVar1;
  int iVar2;
  __int_type_conflict _Var3;
  ulong uVar4;
  __int_type_conflict _Var5;
  bool bVar6;
  string local_50;
  
  uVar4 = 0;
  _Var5 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
  while( true ) {
    if ((desired <= _Var5) || (MAX_ATTEMPTS - 1 < uVar4)) {
      bVar6 = true;
      if ((this->precommit_index_).super___atomic_base<unsigned_long>._M_i < desired) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar1 != (element_type *)0x0) &&
           (iVar2 = (**(code **)(*(long *)peVar1 + 0x38))(), 1 < iVar2)) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_50,
                     "updating precommit_index_ failed after %zu/%zu attempts, last seen precommit_index_ %lu, target %lu"
                     ,uVar4,MAX_ATTEMPTS,_Var5,desired);
          (**(code **)(*(long *)peVar1 + 0x40))
                    (peVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"try_update_precommit_index",0x3b6,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        bVar6 = false;
      }
      return bVar6;
    }
    LOCK();
    _Var3 = (this->precommit_index_).super___atomic_base<unsigned_long>._M_i;
    bVar6 = _Var5 == _Var3;
    if (bVar6) {
      (this->precommit_index_).super___atomic_base<unsigned_long>._M_i = desired;
      _Var3 = _Var5;
    }
    UNLOCK();
    if (bVar6) break;
    uVar4 = uVar4 + 1;
    _Var5 = _Var3;
  }
  return true;
}

Assistant:

bool raft_server::try_update_precommit_index(ulong desired, const size_t MAX_ATTEMPTS) {
    // If `MAX_ATTEMPTS == 0`, try forever.
    size_t num_attempts = 0;
    ulong prev_precommit_index = precommit_index_;
    while ( prev_precommit_index < desired &&
            (num_attempts < MAX_ATTEMPTS || MAX_ATTEMPTS == 0) ) {
        if ( precommit_index_.compare_exchange_strong( prev_precommit_index,
                                                       desired ) ) {
            return true;
        }
        // Otherwise: retry until `precommit_index_` is equal to or greater than
        //            `desired`.
        num_attempts++;
    }
    if (precommit_index_ >= desired) {
        return true;
    }
    p_er("updating precommit_index_ failed after %zu/%zu attempts, "
         "last seen precommit_index_ %" PRIu64 ", target %" PRIu64,
         num_attempts, MAX_ATTEMPTS, prev_precommit_index, desired);
    return false;
}